

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::ProgramInputOutputReferencedByCase::iterate
          (ProgramInputOutputReferencedByCase *this)

{
  ShaderType SVar1;
  Program *programDefinition;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  ShaderType SVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_00;
  TestLog *pTVar8;
  undefined8 uVar9;
  MessageBuilder *pMVar10;
  ContextInfo *this_00;
  bool bVar11;
  Enum<int,_2UL> EVar12;
  bool local_a5d;
  MessageBuilder local_9d8;
  GetNameFunc local_858;
  int local_850;
  Enum<int,_2UL> local_848;
  char *local_838;
  MessageBuilder local_830;
  MessageBuilder local_6b0;
  char *local_530;
  char *local_528;
  MessageBuilder local_520;
  int local_3a0;
  uint local_39c;
  GLint written;
  GLint value;
  int iStack_390;
  bool expected;
  GLenum prop;
  int propNdx;
  int local_204;
  int local_200;
  GLuint resourceIndex;
  GLenum programGLInterface;
  string targetResourceName;
  ProgramSources local_1c8;
  undefined1 local_f8 [8];
  ShaderProgram program;
  Functions *gl;
  bool isInputCase;
  ProgramInputOutputReferencedByCase *this_local;
  
  bVar11 = true;
  if (this->m_targetStorage != STORAGE_IN) {
    bVar11 = this->m_targetStorage == STORAGE_PATCH_IN;
  }
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar7->_vptr_RenderContext[3])();
  program.m_program.m_info.linkTimeUs = CONCAT44(extraout_var,iVar4);
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  generateProgramInterfaceProgramSources(&local_1c8,this->m_program);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_f8,pRVar7,&local_1c8);
  glu::ProgramSources::~ProgramSources(&local_1c8);
  __s = "shaderOutput";
  if (bVar11) {
    __s = "shaderInput";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&programGLInterface,__s,(allocator<char> *)((long)&resourceIndex + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&resourceIndex + 3));
  local_200 = 0x92e4 - (uint)bVar11;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  programDefinition = this->m_program;
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar7->_vptr_RenderContext[3])();
  pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  checkAndLogProgram((ShaderProgram *)local_f8,programDefinition,
                     (Functions *)CONCAT44(extraout_var_00,iVar4),pTVar8);
  pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x9a8);
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f8);
  iVar4 = local_200;
  uVar9 = std::__cxx11::string::c_str();
  local_204 = (*pcVar2)(dVar5,iVar4,uVar9);
  dVar5 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
  glu::checkError(dVar5,"query resource index",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                  ,0xbe3);
  if (local_204 == -1) {
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&propNdx,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&propNdx,(char (*) [28])"Error, query for resource \"");
    pMVar10 = tcu::MessageBuilder::operator<<
                        (pMVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&programGLInterface);
    pMVar10 = tcu::MessageBuilder::operator<<
                        (pMVar10,(char (*) [32])"\" index returned invalid index.");
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&propNdx);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "could not find target resource");
  }
  else {
    for (iStack_390 = 0; iStack_390 < 6; iStack_390 = iStack_390 + 1) {
      if (iterate::targetProps[iStack_390].extension == (char *)0x0) {
LAB_0225f04f:
        value = iterate::targetProps[iStack_390].propName;
        if (bVar11 == false) {
          SVar1 = iterate::targetProps[iStack_390].shaderType;
          SVar6 = ProgramInterfaceDefinition::Program::getLastStage(this->m_program);
          local_a5d = SVar1 == SVar6;
        }
        else {
          SVar1 = iterate::targetProps[iStack_390].shaderType;
          SVar6 = ProgramInterfaceDefinition::Program::getFirstStage(this->m_program);
          local_a5d = SVar1 == SVar6;
        }
        written._3_1_ = local_a5d;
        local_39c = 0xffffffff;
        local_3a0 = -1;
        pTVar8 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_520,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<(&local_520,(char (*) [11])"Verifying ");
        local_528 = glu::getProgramResourcePropertyName(value);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_528);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [13])0x2c2d409);
        local_530 = "FALSE";
        if ((written._3_1_ & 1) != 0) {
          local_530 = "TRUE";
        }
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_530);
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_520);
        pcVar2 = *(code **)(program.m_program.m_info.linkTimeUs + 0x9c8);
        dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_f8);
        (*pcVar2)(dVar5,local_200,local_204,1,&value,1,&local_3a0,&local_39c);
        dVar5 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
        glu::checkError(dVar5,"query buffer binding",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                        ,0xbf9);
        if (local_3a0 == 1) {
          pTVar8 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_830,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
          local_838 = glu::getProgramResourcePropertyName(value);
          pMVar10 = tcu::MessageBuilder::operator<<(&local_830,&local_838);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [4])0x2be9a12);
          EVar12 = glu::getBooleanStr(local_39c);
          local_858 = EVar12.m_getName;
          local_850 = EVar12.m_value;
          local_848.m_getName = local_858;
          local_848.m_value = local_850;
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_848);
          tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_830);
          if (local_39c != ((written._3_1_ & 1) != 0)) {
            pTVar8 = tcu::TestContext::getLog
                               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_9d8,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar10 = tcu::MessageBuilder::operator<<
                                (&local_9d8,(char (*) [28])"Error, got unexpected value");
            tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_9d8);
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"unexpected property value");
          }
        }
        else {
          pTVar8 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_6b0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar10 = tcu::MessageBuilder::operator<<
                              (&local_6b0,
                               (char (*) [68])
                               "Error, query for referenced_by_* returned invalid number of values."
                              );
          tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_6b0);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"property query failed");
        }
      }
      else {
        this_00 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
        bVar3 = glu::ContextInfo::isExtensionSupported
                          (this_00,iterate::targetProps[iStack_390].extension);
        if (bVar3) goto LAB_0225f04f;
      }
    }
  }
  prop = 1;
  std::__cxx11::string::~string((string *)&programGLInterface);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_f8);
  return STOP;
}

Assistant:

ProgramInputOutputReferencedByCase::IterateResult ProgramInputOutputReferencedByCase::iterate (void)
{
	static const struct
	{
		glw::GLenum		propName;
		glu::ShaderType	shaderType;
		const char*		extension;
	} targetProps[] =
	{
		{ GL_REFERENCED_BY_VERTEX_SHADER,			glu::SHADERTYPE_VERTEX,						DE_NULL							},
		{ GL_REFERENCED_BY_FRAGMENT_SHADER,			glu::SHADERTYPE_FRAGMENT,					DE_NULL							},
		{ GL_REFERENCED_BY_COMPUTE_SHADER,			glu::SHADERTYPE_COMPUTE,					DE_NULL							},
		{ GL_REFERENCED_BY_TESS_CONTROL_SHADER,		glu::SHADERTYPE_TESSELLATION_CONTROL,		"GL_EXT_tessellation_shader"	},
		{ GL_REFERENCED_BY_TESS_EVALUATION_SHADER,	glu::SHADERTYPE_TESSELLATION_EVALUATION,	"GL_EXT_tessellation_shader"	},
		{ GL_REFERENCED_BY_GEOMETRY_SHADER,			glu::SHADERTYPE_GEOMETRY,					"GL_EXT_geometry_shader"		},
	};

	const bool					isInputCase						= (m_targetStorage == glu::STORAGE_IN || m_targetStorage == glu::STORAGE_PATCH_IN);
	const glw::Functions&		gl								= m_context.getRenderContext().getFunctions();
	const glu::ShaderProgram	program							(m_context.getRenderContext(), generateProgramInterfaceProgramSources(m_program));
	const std::string			targetResourceName				= (isInputCase) ? ("shaderInput") : ("shaderOutput");
	const glw::GLenum			programGLInterface				= (isInputCase) ? (GL_PROGRAM_INPUT) : (GL_PROGRAM_OUTPUT);
	glw::GLuint					resourceIndex;

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	checkAndLogProgram(program, m_program, m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	// find target resource index

	resourceIndex = gl.getProgramResourceIndex(program.getProgram(), programGLInterface, targetResourceName.c_str());
	GLU_EXPECT_NO_ERROR(gl.getError(), "query resource index");

	if (resourceIndex == GL_INVALID_INDEX)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for resource \"" << targetResourceName << "\" index returned invalid index." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "could not find target resource");
		return STOP;
	}

	// check props
	for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(targetProps); ++propNdx)
	{
		if (targetProps[propNdx].extension == DE_NULL || m_context.getContextInfo().isExtensionSupported(targetProps[propNdx].extension))
		{
			const glw::GLenum	prop			= targetProps[propNdx].propName;
			const bool			expected		= (isInputCase) ? (targetProps[propNdx].shaderType == m_program->getFirstStage()) : (targetProps[propNdx].shaderType == m_program->getLastStage());
			glw::GLint			value			= -1;
			glw::GLint			written			= -1;

			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying " << glu::getProgramResourcePropertyName(prop) << ", expecting " << ((expected) ? ("TRUE") : ("FALSE")) << tcu::TestLog::EndMessage;

			gl.getProgramResourceiv(program.getProgram(), programGLInterface, resourceIndex, 1, &prop, 1, &written, &value);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query buffer binding");

			if (written != 1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for referenced_by_* returned invalid number of values." << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "property query failed");
				continue;
			}

			m_testCtx.getLog() << tcu::TestLog::Message << glu::getProgramResourcePropertyName(prop) << " = " << glu::getBooleanStr(value) << tcu::TestLog::EndMessage;

			if (value != ((expected) ? (GL_TRUE) : (GL_FALSE)))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, got unexpected value" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "unexpected property value");
				continue;
			}
		}
	}

	return STOP;
}